

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O3

u32 crc32_slice8(u32 crc,u8 *p,size_t len)

{
  uint *puVar1;
  uint uVar2;
  ulong uVar3;
  uint *puVar4;
  long lVar5;
  uint uVar6;
  u8 *puVar7;
  bool bVar8;
  
  puVar1 = (uint *)(p + len);
  puVar7 = p;
  if (len != 0 && ((ulong)p & 7) != 0) {
    lVar5 = len - 1;
    do {
      crc = crc >> 8 ^ crc32_slice8_table[(uint)(byte)*(uint *)p ^ crc & 0xff];
      p = (u8 *)((long)p + 1);
      puVar7 = puVar7 + 1;
      if (((ulong)puVar7 & 7) == 0) break;
      bVar8 = lVar5 != 0;
      lVar5 = lVar5 + -1;
    } while (bVar8);
  }
  uVar3 = (long)puVar1 - (long)puVar7 & 0xfffffffffffffff8;
  puVar4 = (uint *)p;
  if (uVar3 != 0) {
    puVar4 = (uint *)(uVar3 + (long)p);
    do {
      uVar2 = *(uint *)((long)p + 4);
      uVar6 = crc ^ *(uint *)p;
      crc = *(uint *)((long)crc32_slice8_table + (ulong)(uVar6 >> 6 & 0x3fc) + 0x1800) ^
            crc32_slice8_table[(ulong)(uVar6 & 0xff) + 0x700] ^
            *(uint *)((long)crc32_slice8_table + (ulong)(uVar6 >> 0xe & 0x3fc) + 0x1400) ^
            *(uint *)((long)crc32_slice8_table + (ulong)(uVar6 >> 0x16 & 0xfffffffc) + 0x1000) ^
            crc32_slice8_table[(ulong)(uVar2 & 0xff) + 0x300] ^
            *(uint *)((long)crc32_slice8_table + (ulong)(uVar2 >> 6 & 0x3fc) + 0x800) ^
            *(uint *)((long)crc32_slice8_table + (ulong)(uVar2 >> 0xe & 0x3fc) + 0x400) ^
            crc32_slice8_table[uVar2 >> 0x18];
      p = (u8 *)((long)p + 8);
    } while ((uint *)p != puVar4);
  }
  for (; puVar4 != puVar1; puVar4 = (uint *)((long)puVar4 + 1)) {
    crc = crc >> 8 ^ crc32_slice8_table[(uint)(byte)*puVar4 ^ crc & 0xff];
  }
  return crc;
}

Assistant:

static u32 MAYBE_UNUSED
crc32_slice8(u32 crc, const u8 *p, size_t len)
{
	const u8 * const end = p + len;
	const u8 *end64;

	for (; ((uintptr_t)p & 7) && p != end; p++)
		crc = (crc >> 8) ^ crc32_slice8_table[(u8)crc ^ *p];

	end64 = p + ((end - p) & ~7);
	for (; p != end64; p += 8) {
		u32 v1 = le32_bswap(*(const u32 *)(p + 0));
		u32 v2 = le32_bswap(*(const u32 *)(p + 4));

		crc = crc32_slice8_table[0x700 + (u8)((crc ^ v1) >> 0)] ^
		      crc32_slice8_table[0x600 + (u8)((crc ^ v1) >> 8)] ^
		      crc32_slice8_table[0x500 + (u8)((crc ^ v1) >> 16)] ^
		      crc32_slice8_table[0x400 + (u8)((crc ^ v1) >> 24)] ^
		      crc32_slice8_table[0x300 + (u8)(v2 >> 0)] ^
		      crc32_slice8_table[0x200 + (u8)(v2 >> 8)] ^
		      crc32_slice8_table[0x100 + (u8)(v2 >> 16)] ^
		      crc32_slice8_table[0x000 + (u8)(v2 >> 24)];
	}

	for (; p != end; p++)
		crc = (crc >> 8) ^ crc32_slice8_table[(u8)crc ^ *p];

	return crc;
}